

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O2

string * __thiscall
Uri::Uri::makeFsPath_abi_cxx11_(string *__return_storage_ptr__,Uri *this,Uri *uri)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->authority)._M_string_length == 0) || ((this->path)._M_string_length < 2)) {
LAB_0016fac9:
    if ((1 < (this->path)._M_string_length) &&
       (pcVar2 = (this->path)._M_dataplus._M_p, *pcVar2 == '/')) {
      cVar1 = pcVar2[1];
      iVar4 = isalpha((int)cVar1);
      if ((iVar4 != 0) && (pcVar2[2] == ':')) {
        iVar4 = tolower((int)cVar1);
        std::__cxx11::string::substr((ulong)&local_60,(ulong)&this->path);
        std::operator+(&local_40,(char)iVar4,&local_60);
        goto LAB_0016fb23;
      }
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    bVar3 = std::operator==(&this->scheme,"file");
    if (!bVar3) goto LAB_0016fac9;
    std::operator+(&local_60,"//",&this->authority);
    std::operator+(&local_40,&local_60,&this->path);
LAB_0016fb23:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

string Uri::makeFsPath (const Uri &uri) {
    string value {};

    if (!uri.authority.empty() && uri.path.length() > 1 && uri.scheme == "file") {
        value = "//" + uri.authority + uri.path;
    } else if (
            uri.path.length() >= 2
            && uri.path[0] == CharCode::Slash
            && std::isalpha(uri.path[1])
            && uri.path[2] == CharCode::Colon
            ) {
        value = static_cast<char>(std::tolower(uri.path[1])) + uri.path.substr(2);
    } else {
        value = uri.path;
    }

    if (IS_WINDOWS) {
        forwardToBackslashes(value);
    }

    return value;
}